

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall cashew::ValueBuilder::makeContinue(ValueBuilder *this,IString label)

{
  bool bVar1;
  Value *pVVar2;
  Ref r;
  Ref local_38;
  Ref local_28;
  undefined1 local_20 [8];
  IString label_local;
  
  label_local.str._M_len = label.str._M_len;
  local_20 = (undefined1  [8])this;
  local_28 = makeRawArray(2);
  pVVar2 = Ref::operator->(&local_28);
  r = makeRawString((IString *)CONTINUE);
  pVVar2 = cashew::Value::push_back(pVVar2,r);
  bVar1 = ::wasm::IString::operator_cast_to_bool((IString *)local_20);
  if (bVar1) {
    local_38 = makeRawString((IString *)local_20);
  }
  else {
    local_38 = makeNull();
  }
  pVVar2 = cashew::Value::push_back(pVVar2,local_38);
  Ref::Ref((Ref *)&label_local.str._M_str,pVVar2);
  return (Ref)(Value *)label_local.str._M_str;
}

Assistant:

static Ref makeContinue(IString label) {
    return &makeRawArray(2)
              ->push_back(makeRawString(CONTINUE))
              .push_back(!!label ? makeRawString(label) : makeNull());
  }